

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

int get_old_new(char *dir,FileName *varray,char *afile,char *vfile)

{
  int iVar1;
  ulong uVar2;
  char *local_3158;
  char *lf_cp2_12;
  char *lf_cp1_12;
  char *lf_cp2_11;
  char *lf_cp1_11;
  FileName *centry_2;
  char *lf_cp2_10;
  char *lf_cp1_10;
  char *lf_cp2_9;
  char *lf_cp1_9;
  char *lf_cp2_8;
  char *lf_cp1_8;
  FileName *centry_1;
  char *lf_cp2_7;
  char *lf_cp1_7;
  char *lf_cp2_6;
  char *lf_cp1_6;
  char *lf_cp2_5;
  char *lf_cp1_5;
  char *lf_cp2_4;
  char *lf_cp1_4;
  FileName *centry;
  char *lf_cp2_3;
  char *lf_cp1_3;
  char *lf_cp2_2;
  char *lf_cp1_2;
  char *lf_cp2_1;
  char *lf_cp1_1;
  char *lf_cp2;
  char *lf_cp1;
  FileName *entry;
  uint local_3060;
  int highest_p;
  uint max_no;
  uint ver_no;
  char vbuf [16];
  char ver [16];
  char to_file [4096];
  char vless [4096];
  char name [4096];
  char *vfile_local;
  char *afile_local;
  FileName *varray_local;
  char *dir_local;
  
  strcpy(vless + 0xff8,afile);
  separate_version(vless + 0xff8,vbuf + 8,1);
  if (varray->version_no == 0xffffffff) {
    if ((vbuf[8] == '\0') ||
       (iVar1 = strcmp(vbuf + 8,"1"), lf_cp1_3 = dir, lf_cp2_2 = dir, iVar1 == 0)) {
      strcpy(afile,vless + 0xff8);
      strcat(afile,".~");
      strcat(afile,"1");
      strcat(afile,"~");
      lf_cp2 = dir;
      for (lf_cp1_1 = dir; *lf_cp1_1 != '\0'; lf_cp1_1 = lf_cp1_1 + 1) {
        if (*lf_cp1_1 == '/') {
          lf_cp2 = lf_cp1_1;
        }
      }
      lf_cp1_2 = dir;
      lf_cp2_1 = dir;
      if (lf_cp2 == lf_cp1_1 + -1) {
        if (lf_cp2 == dir) {
          strcpy(vfile,"/");
          strcat(vfile,afile);
        }
        else {
          strcpy(vfile,dir);
          strcat(vfile,afile);
        }
      }
      else {
        strcpy(vfile,dir);
        strcat(vfile,"/");
        strcat(vfile,afile);
      }
      for (; *lf_cp1_2 != '\0'; lf_cp1_2 = lf_cp1_2 + 1) {
        if (*lf_cp1_2 == '/') {
          lf_cp2_1 = lf_cp1_2;
        }
      }
      if (lf_cp2_1 == lf_cp1_2 + -1) {
        if (lf_cp2_1 == dir) {
          strcpy(afile,"/");
          strcat(afile,vless + 0xff8);
        }
        else {
          strcpy(afile,dir);
          strcat(afile,vless + 0xff8);
        }
      }
      else {
        strcpy(afile,dir);
        strcat(afile,"/");
        strcat(afile,vless + 0xff8);
      }
      dir_local._4_4_ = 1;
    }
    else {
      for (; *lf_cp1_3 != '\0'; lf_cp1_3 = lf_cp1_3 + 1) {
        if (*lf_cp1_3 == '/') {
          lf_cp2_2 = lf_cp1_3;
        }
      }
      if (lf_cp2_2 == lf_cp1_3 + -1) {
        if (lf_cp2_2 == dir) {
          strcpy(vfile,"/");
          strcat(vfile,afile);
        }
        else {
          strcpy(vfile,dir);
          strcat(vfile,afile);
        }
      }
      else {
        strcpy(vfile,dir);
        strcat(vfile,"/");
        strcat(vfile,afile);
      }
      strcpy(afile,vfile);
      dir_local._4_4_ = 1;
    }
  }
  else {
    iVar1 = get_versionless(varray,to_file + 0xff8,dir);
    afile_local = varray->name;
    if (iVar1 == 0) {
      if (vbuf[8] == '\0') {
        local_3060 = varray->version_no;
        lf_cp2_3 = dir;
        for (centry = (FileName *)dir; centry->name[0] != '\0';
            centry = (FileName *)(centry->name + 1)) {
          if (centry->name[0] == '/') {
            lf_cp2_3 = centry->name;
          }
        }
        if (lf_cp2_3 == (char *)((long)&centry[-1].version_no + 3)) {
          if (lf_cp2_3 == dir) {
            strcpy(afile,"/");
            strcat(afile,varray->name);
          }
          else {
            strcpy(afile,dir);
            strcat(afile,varray->name);
          }
        }
        else {
          strcpy(afile,dir);
          strcat(afile,"/");
          strcat(afile,varray->name);
        }
        strcpy(vfile,afile);
        dir_local._4_4_ = 1;
      }
      else {
        uVar2 = strtoul(vbuf + 8,(char **)0x0,10);
        highest_p = (int)uVar2;
        lf_cp1 = (char *)0x0;
        for (lf_cp1_4 = varray->name; *(int *)(lf_cp1_4 + 0x1000) != -1;
            lf_cp1_4 = lf_cp1_4 + 0x1004) {
          if (*(int *)(lf_cp1_4 + 0x1000) == highest_p) {
            lf_cp1 = lf_cp1_4;
            break;
          }
        }
        lf_cp1_5 = dir;
        lf_cp2_4 = dir;
        if (lf_cp1 == (char *)0x0) {
          for (; *(int *)(afile_local + 0x1000) != -1; afile_local = afile_local + 0x1004) {
          }
          lf_cp1_6 = dir;
          lf_cp2_5 = dir;
          if (vbuf[8] == '\0') {
            strcpy(afile,afile_local);
          }
          else {
            strcpy(afile,afile_local);
            strcat(afile,".~");
            strcat(afile,vbuf + 8);
            strcat(afile,"~");
          }
          for (; *lf_cp1_6 != '\0'; lf_cp1_6 = lf_cp1_6 + 1) {
            if (*lf_cp1_6 == '/') {
              lf_cp2_5 = lf_cp1_6;
            }
          }
          if (lf_cp2_5 == lf_cp1_6 + -1) {
            if (lf_cp2_5 == dir) {
              strcpy(vfile,"/");
              strcat(vfile,afile);
            }
            else {
              strcpy(vfile,dir);
              strcat(vfile,afile);
            }
          }
          else {
            strcpy(vfile,dir);
            strcat(vfile,"/");
            strcat(vfile,afile);
          }
          strcpy(afile,vfile);
          dir_local._4_4_ = 1;
        }
        else {
          for (; *lf_cp1_5 != '\0'; lf_cp1_5 = lf_cp1_5 + 1) {
            if (*lf_cp1_5 == '/') {
              lf_cp2_4 = lf_cp1_5;
            }
          }
          if (lf_cp2_4 == lf_cp1_5 + -1) {
            if (lf_cp2_4 == dir) {
              strcpy(afile,"/");
              strcat(afile,lf_cp1);
            }
            else {
              strcpy(afile,dir);
              strcat(afile,lf_cp1);
            }
          }
          else {
            strcpy(afile,dir);
            strcat(afile,"/");
            strcat(afile,lf_cp1);
          }
          strcpy(vfile,afile);
          dir_local._4_4_ = 1;
        }
      }
    }
    else if ((varray->version_no == 0) && (varray[1].version_no == 0xffffffff)) {
      if (vbuf[8] == '\0') {
        strcpy(vfile,to_file + 0xff8);
        strcat(vfile,".~");
        strcat(vfile,"1");
        strcat(vfile,"~");
        strcpy(afile,to_file + 0xff8);
        dir_local._4_4_ = 1;
      }
      else {
        uVar2 = strtoul(vbuf + 8,(char **)0x0,10);
        highest_p = (int)uVar2;
        centry_1 = (FileName *)dir;
        lf_cp2_7 = dir;
        if (highest_p == 1) {
          strcpy(afile,vless + 0xff8);
          strcat(afile,".~");
          strcat(afile,"1");
          strcat(afile,"~");
          lf_cp2_6 = dir;
          for (lf_cp1_7 = dir; *lf_cp1_7 != '\0'; lf_cp1_7 = lf_cp1_7 + 1) {
            if (*lf_cp1_7 == '/') {
              lf_cp2_6 = lf_cp1_7;
            }
          }
          if (lf_cp2_6 == lf_cp1_7 + -1) {
            if (lf_cp2_6 == dir) {
              strcpy(vfile,"/");
              strcat(vfile,afile);
            }
            else {
              strcpy(vfile,dir);
              strcat(vfile,afile);
            }
          }
          else {
            strcpy(vfile,dir);
            strcat(vfile,"/");
            strcat(vfile,afile);
          }
          strcpy(afile,to_file + 0xff8);
          dir_local._4_4_ = 1;
        }
        else {
          for (; centry_1->name[0] != '\0'; centry_1 = (FileName *)(centry_1->name + 1)) {
            if (centry_1->name[0] == '/') {
              lf_cp2_7 = centry_1->name;
            }
          }
          if (lf_cp2_7 == (char *)((long)&centry_1[-1].version_no + 3)) {
            if (lf_cp2_7 == dir) {
              strcpy(vfile,"/");
              strcat(vfile,afile);
            }
            else {
              strcpy(vfile,dir);
              strcat(vfile,afile);
            }
          }
          else {
            strcpy(vfile,dir);
            strcat(vfile,"/");
            strcat(vfile,afile);
          }
          strcpy(afile,vfile);
          dir_local._4_4_ = 1;
        }
      }
    }
    else {
      iVar1 = check_vless_link(to_file + 0xff8,varray,ver + 8,(int *)((long)&entry + 4));
      if (iVar1 == 0) {
        dir_local._4_4_ = 0;
      }
      else if (ver[8] == '\0') {
        if (vbuf[8] == '\0') {
          local_3060 = varray->version_no;
          sprintf((char *)&max_no,"%u",(ulong)(local_3060 + 1));
          if ((char)max_no == '\0') {
            strcpy(vfile,to_file + 0xff8);
          }
          else {
            strcpy(vfile,to_file + 0xff8);
            strcat(vfile,".~");
            strcat(vfile,(char *)&max_no);
            strcat(vfile,"~");
          }
          strcpy(afile,to_file + 0xff8);
          dir_local._4_4_ = 1;
        }
        else {
          uVar2 = strtoul(vbuf + 8,(char **)0x0,10);
          highest_p = (int)uVar2;
          local_3060 = varray->version_no;
          if (highest_p == local_3060 + 1) {
            sprintf((char *)&max_no,"%u",uVar2 & 0xffffffff);
            if ((char)max_no == '\0') {
              strcpy(vfile,to_file + 0xff8);
            }
            else {
              strcpy(vfile,to_file + 0xff8);
              strcat(vfile,".~");
              strcat(vfile,(char *)&max_no);
              strcat(vfile,"~");
            }
            strcpy(afile,to_file + 0xff8);
            dir_local._4_4_ = 1;
          }
          else {
            lf_cp1 = (char *)0x0;
            for (lf_cp1_8 = varray->name; *(int *)(lf_cp1_8 + 0x1000) != -1;
                lf_cp1_8 = lf_cp1_8 + 0x1004) {
              if (*(int *)(lf_cp1_8 + 0x1000) == highest_p) {
                lf_cp1 = lf_cp1_8;
                break;
              }
            }
            lf_cp1_9 = dir;
            lf_cp2_8 = dir;
            if (lf_cp1 == (char *)0x0) {
              for (; *(int *)(afile_local + 0x1000) != -1; afile_local = afile_local + 0x1004) {
              }
              lf_cp1_10 = dir;
              lf_cp2_9 = dir;
              if (vbuf[8] == '\0') {
                strcpy(afile,afile_local);
              }
              else {
                strcpy(afile,afile_local);
                strcat(afile,".~");
                strcat(afile,vbuf + 8);
                strcat(afile,"~");
              }
              for (; *lf_cp1_10 != '\0'; lf_cp1_10 = lf_cp1_10 + 1) {
                if (*lf_cp1_10 == '/') {
                  lf_cp2_9 = lf_cp1_10;
                }
              }
              if (lf_cp2_9 == lf_cp1_10 + -1) {
                if (lf_cp2_9 == dir) {
                  strcpy(vfile,"/");
                  strcat(vfile,afile);
                }
                else {
                  strcpy(vfile,dir);
                  strcat(vfile,afile);
                }
              }
              else {
                strcpy(vfile,dir);
                strcat(vfile,"/");
                strcat(vfile,afile);
              }
              strcpy(afile,vfile);
              dir_local._4_4_ = 1;
            }
            else {
              for (; *lf_cp1_9 != '\0'; lf_cp1_9 = lf_cp1_9 + 1) {
                if (*lf_cp1_9 == '/') {
                  lf_cp2_8 = lf_cp1_9;
                }
              }
              if (lf_cp2_8 == lf_cp1_9 + -1) {
                if (lf_cp2_8 == dir) {
                  strcpy(afile,"/");
                  strcat(afile,lf_cp1);
                }
                else {
                  strcpy(afile,dir);
                  strcat(afile,lf_cp1);
                }
              }
              else {
                strcpy(afile,dir);
                strcat(afile,"/");
                strcat(afile,lf_cp1);
              }
              strcpy(vfile,afile);
              dir_local._4_4_ = 1;
            }
          }
        }
      }
      else if (vbuf[8] == '\0') {
        local_3060 = varray->version_no;
        lf_cp2_10 = dir;
        for (centry_2 = (FileName *)dir; centry_2->name[0] != '\0';
            centry_2 = (FileName *)(centry_2->name + 1)) {
          if (centry_2->name[0] == '/') {
            lf_cp2_10 = centry_2->name;
          }
        }
        if (lf_cp2_10 == (char *)((long)&centry_2[-1].version_no + 3)) {
          if (lf_cp2_10 == dir) {
            strcpy(afile,"/");
            strcat(afile,varray->name);
          }
          else {
            strcpy(afile,dir);
            strcat(afile,varray->name);
          }
        }
        else {
          strcpy(afile,dir);
          strcat(afile,"/");
          strcat(afile,varray->name);
        }
        strcpy(vfile,afile);
        dir_local._4_4_ = 1;
      }
      else {
        uVar2 = strtoul(vbuf + 8,(char **)0x0,10);
        highest_p = (int)uVar2;
        lf_cp1 = (char *)0x0;
        for (lf_cp1_11 = varray->name; *(int *)(lf_cp1_11 + 0x1000) != -1;
            lf_cp1_11 = lf_cp1_11 + 0x1004) {
          if (*(int *)(lf_cp1_11 + 0x1000) == highest_p) {
            lf_cp1 = lf_cp1_11;
            break;
          }
        }
        lf_cp1_12 = dir;
        lf_cp2_11 = dir;
        if (lf_cp1 == (char *)0x0) {
          local_3060 = varray->version_no;
          strcpy(to_file + 0xff8,varray->name);
          separate_version(to_file + 0xff8,(char *)&max_no,1);
          lf_cp2_12 = dir;
          for (local_3158 = dir; *local_3158 != '\0'; local_3158 = local_3158 + 1) {
            if (*local_3158 == '/') {
              lf_cp2_12 = local_3158;
            }
          }
          if (lf_cp2_12 == local_3158 + -1) {
            if (lf_cp2_12 == dir) {
              strcpy(afile,"/");
              strcat(afile,to_file + 0xff8);
            }
            else {
              strcpy(afile,dir);
              strcat(afile,to_file + 0xff8);
            }
          }
          else {
            strcpy(afile,dir);
            strcat(afile,"/");
            strcat(afile,to_file + 0xff8);
          }
          if (vbuf[8] == '\0') {
            strcpy(vfile,afile);
          }
          else {
            strcpy(vfile,afile);
            strcat(vfile,".~");
            strcat(vfile,vbuf + 8);
            strcat(vfile,"~");
          }
          strcpy(afile,vfile);
          dir_local._4_4_ = 1;
        }
        else {
          for (; *lf_cp1_12 != '\0'; lf_cp1_12 = lf_cp1_12 + 1) {
            if (*lf_cp1_12 == '/') {
              lf_cp2_11 = lf_cp1_12;
            }
          }
          if (lf_cp2_11 == lf_cp1_12 + -1) {
            if (lf_cp2_11 == dir) {
              strcpy(afile,"/");
              strcat(afile,lf_cp1);
            }
            else {
              strcpy(afile,dir);
              strcat(afile,lf_cp1);
            }
          }
          else {
            strcpy(afile,dir);
            strcat(afile,"/");
            strcat(afile,lf_cp1);
          }
          strcpy(vfile,afile);
          dir_local._4_4_ = 1;
        }
      }
    }
  }
  return dir_local._4_4_;
}

Assistant:

static int get_old_new(char *dir, FileName *varray, char *afile, char *vfile)
{
  char name[MAXPATHLEN], vless[MAXPATHLEN], to_file[MAXPATHLEN];
  char ver[VERSIONLEN], vbuf[VERSIONLEN];
  unsigned ver_no, max_no;
  int highest_p;
  FileName *entry;

  strcpy(name, afile);
  separate_version(name, ver, 1);

  if (NoFileP(varray)) {
    /*
     * If there is no file with such name, "old/new" file is always
     * recognized.
     */
    if (*ver == '\0' || strcmp(ver, "1") == 0) {
      /*
       * If version is not specified or 1 is specified,
       * we can return versionless file as afile.
       */
      ConcNameAndVersion(name, "1", afile);
      ConcDirAndName(dir, afile, vfile);
      ConcDirAndName(dir, name, afile);
      return (1);
    } else {
      /*
       * A version other than 1 is specified.  "New" file
       * is recognized as if.
       */
      ConcDirAndName(dir, afile, vfile);
      strcpy(afile, vfile);
      return (1);
    }
  }

  if (get_versionless(varray, vless, dir) == 0) {
    /*
     * There is no versionless file, but at least one versioned
     * file exists.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The highest versioned file
       * is an old file.
       */
      FindHighestVersion(varray, entry, max_no);
      ConcDirAndName(dir, entry->name, afile);
      strcpy(vfile, afile);
      return (1);
    } else {
      /*
       * A version is specified.  We have to walk thorough
       * varray and try to find the file with the specified
       * version.
       */
      ver_no = strtoul(ver, (char **)NULL, 10);
      FindSpecifiedVersion(varray, entry, ver_no);
      if (entry != NULL) {
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      }
      /*
       * There is not a file with the specified version in varray.
       * The specified file can be recognized as if.
       * Most user will hope to create a new file in same case as
       * old.   One of case sensitive names in the files are stored
       * in the trail marker entry in varray by get_version_array
       * routine.
       * We will use it, although we cannot say all of the gathered
       * files has the name in same case.
       */
      while (varray->version_no != LASTVERSIONARRAY) varray++;
      ConcNameAndVersion(varray->name, ver, afile);
      ConcDirAndName(dir, afile, vfile);
      strcpy(afile, vfile);
      return (1);
    }
  } else if (OnlyVersionlessP(varray)) {
    /*
     * There is only versionless file in varray.
     * If the specified version is 1 the versionless file is regarded
     * as version 1 file.
     */
    if (*ver == '\0') {
      /*
       * No version is specified.  The versionless file is dealt
       * with as version 1.
       */
      ConcNameAndVersion(vless, "1", vfile);
      strcpy(afile, vless);
      return (1);
    } else {
      ver_no = strtoul(ver, (char **)NULL, 10);
      if (ver_no == 1) {
        /*
         * Version 1 is specified.  The versionless file is
         * dealt with as a version 1 file.
         */
        ConcNameAndVersion(name, "1", afile);
        ConcDirAndName(dir, afile, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /*
         * Other versions than 1 are recognized as if.
         */
        ConcDirAndName(dir, afile, vfile);
        strcpy(afile, vfile);
        return (1);
      }
    }
  } else {
    if (check_vless_link(vless, varray, to_file, &highest_p) == 0) return (0);
    if (*to_file == '\0') {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is not linked
       * to any file in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The one higher than an
         * existing maximum version is dealt with as the
         * old version, and it should be a version of the
         * link missing versionless file.
         */
        FindHighestVersion(varray, entry, max_no);
        sprintf(vbuf, "%u", max_no + 1);
        ConcNameAndVersion(vless, vbuf, vfile);
        strcpy(afile, vless);
        return (1);
      } else {
        /* A version is specified. */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindHighestVersion(varray, entry, max_no);
        if (ver_no == max_no + 1) {
          /*
           * If the version is one higher than the
           * existing highest version is specified, it
           * is dealt with as a version of the link
           * missing versionless file.
           */
          sprintf(vbuf, "%u", ver_no);
          ConcNameAndVersion(vless, vbuf, vfile);
          strcpy(afile, vless);
          return (1);
        } else {
          /*
           * We have to walk through varray and try
           * to find the file with the specified version.
           */
          FindSpecifiedVersion(varray, entry, ver_no);
          if (entry != NULL) {
            ConcDirAndName(dir, entry->name, afile);
            strcpy(vfile, afile);
            return (1);
          }
          /*
           * There is not a file with the specified
           * version in varray.  The specified file can
           * be recognized as if.
           * Most user will hope to create a new file in
           * same case as old.   One of case sensitive
           * names in the files are stored in the trail
           * marker entry in varray by get_version_array
           * routine.
           * We will use it, although we cannot say all
           * of the gathered files has the name in same
           * case.
           */
          while (varray->version_no != LASTVERSIONARRAY) varray++;
          ConcNameAndVersion(varray->name, ver, afile);
          ConcDirAndName(dir, afile, vfile);
          strcpy(afile, vfile);
          return (1);
        }
      }
    } else {
      /*
       * There is a versionless file in varray and at least one
       * versioned file exists.  The versionless file is linked to
       * one of files in varray.
       */
      if (*ver == '\0') {
        /*
         * No version is specified.  The highest versioned file
         * in varray is an old file.
         */
        FindHighestVersion(varray, entry, max_no);
        ConcDirAndName(dir, entry->name, afile);
        strcpy(vfile, afile);
        return (1);
      } else {
        /*
         * A version is specified.  We have to walk thorough
         * varray and try to find the file with the specified
         * version.
         */
        ver_no = strtoul(ver, (char **)NULL, 10);
        FindSpecifiedVersion(varray, entry, ver_no);
        if (entry != NULL) {
          ConcDirAndName(dir, entry->name, afile);
          strcpy(vfile, afile);
          return (1);
        }
        /*
         * There is not a file with the specified
         * version in varray.  The specified file can
         * be recognized as if.
         * Most user will hope to create a new file in
         * same case as old.   We will use the name of
         * the highest versioned file as the name of the
         * new file.
         */
        FindHighestVersion(varray, entry, max_no);
        strcpy(vless, entry->name);
        separate_version(vless, vbuf, 1);
        ConcDirAndName(dir, vless, afile);
        ConcNameAndVersion(afile, ver, vfile);
        strcpy(afile, vfile);
        return (1);
      }
    }
  }
}